

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

nifti_image * nifti_image_read_bricks(char *hname,int nbricks,int *blist,nifti_brick_list *NBL)

{
  int iVar1;
  nifti_image *nim;
  nifti_brick_list *NBL_local;
  int *blist_local;
  int nbricks_local;
  char *hname_local;
  
  if ((hname == (char *)0x0) || (NBL == (nifti_brick_list *)0x0)) {
    fprintf(_stderr,"** nifti_image_read_bricks: bad params (%p,%p)\n",hname,NBL);
    hname_local = (char *)0x0;
  }
  else if ((blist == (int *)0x0) || (0 < nbricks)) {
    hname_local = (char *)nifti_image_read(hname,0);
    if ((nifti_image *)hname_local == (nifti_image *)0x0) {
      hname_local = (char *)0x0;
    }
    else {
      iVar1 = nifti_image_load_bricks((nifti_image *)hname_local,nbricks,blist,NBL);
      if (iVar1 < 1) {
        nifti_image_free((nifti_image *)hname_local);
        hname_local = (char *)0x0;
      }
      else if (blist != (int *)0x0) {
        update_nifti_image_for_brick_list((nifti_image *)hname_local,nbricks);
      }
    }
  }
  else {
    fprintf(_stderr,"** nifti_image_read_bricks: bad nbricks, %d\n",(ulong)(uint)nbricks);
    hname_local = (char *)0x0;
  }
  return (nifti_image *)hname_local;
}

Assistant:

nifti_image *nifti_image_read_bricks(const char * hname, int nbricks,
                                     const int * blist, nifti_brick_list * NBL)
{
   nifti_image * nim;

   if( !hname || !NBL ){
      fprintf(stderr,"** nifti_image_read_bricks: bad params (%p,%p)\n",
              hname, (void *)NBL);
      return NULL;
   }

   if( blist && nbricks <= 0 ){
      fprintf(stderr,"** nifti_image_read_bricks: bad nbricks, %d\n", nbricks);
      return NULL;
   }

   nim = nifti_image_read(hname, 0);  /* read header, but not data */

   if( !nim ) return NULL;   /* errors were already printed */

   /* if we fail, free image and return */
   if( nifti_image_load_bricks(nim, nbricks, blist, NBL) <= 0 ){
      nifti_image_free(nim);
      return NULL;
   }

   if( blist ) update_nifti_image_for_brick_list(nim, nbricks);

   return nim;
}